

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::GetPrivkeyFromExtkeyRequest::GetPrivkeyFromExtkeyRequest
          (GetPrivkeyFromExtkeyRequest *this)

{
  allocator local_25 [20];
  allocator local_11;
  GetPrivkeyFromExtkeyRequest *local_10;
  GetPrivkeyFromExtkeyRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::GetPrivkeyFromExtkeyRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::GetPrivkeyFromExtkeyRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::GetPrivkeyFromExtkeyRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__GetPrivkeyFromExtkeyRequest_01b3e940;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->extkey_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->network_,"mainnet",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->wif_ = true;
  this->is_compressed_ = true;
  CollectFieldName();
  return;
}

Assistant:

GetPrivkeyFromExtkeyRequest() {
    CollectFieldName();
  }